

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlparse.c
# Opt level: O3

char ctrlparse(char *s,char **next)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  char *pcVar5;
  
  if (*s != '^') {
    pcVar3 = (char *)0x0;
    bVar4 = 0;
    goto LAB_00160cf4;
  }
  bVar4 = s[1];
  pcVar5 = (char *)(ulong)bVar4;
  if (bVar4 != 0) {
    if (bVar4 != 0x3c) {
      if ((byte)(bVar4 + 0x9f) < 0x1a) {
        bVar4 = bVar4 + 0xa0;
      }
      else {
        if (((bVar4 & 0xe0) != 0x40) && (bVar4 != 0x3f && -1 < (char)bVar4)) {
          if (bVar4 != 0x7e) {
            return '\0';
          }
          pcVar3 = s + 2;
          bVar4 = 0x5e;
          goto LAB_00160cf4;
        }
        bVar4 = bVar4 ^ 0x40;
      }
      pcVar3 = s + 2;
      goto LAB_00160cf4;
    }
    pcVar5 = (char *)0x0;
    lVar2 = strtol(s + 2,next,0);
    pcVar1 = *next;
    if (pcVar1 != s + 2) {
      pcVar3 = pcVar1 + 1;
      if (*pcVar1 != '>') {
        pcVar3 = pcVar5;
      }
      bVar4 = (byte)lVar2;
      if (*pcVar1 != '>') {
        bVar4 = 0;
      }
      goto LAB_00160cf4;
    }
  }
  bVar4 = (byte)pcVar5;
  pcVar3 = (char *)0x0;
LAB_00160cf4:
  *next = pcVar3;
  return bVar4;
}

Assistant:

char ctrlparse(char *s, char **next)
{
    char c = 0;
    if (*s != '^') {
        *next = NULL;
    } else {
        s++;
        if (*s == '\0') {
            *next = NULL;
        } else if (*s == '<') {
            s++;
            c = (char)strtol(s, next, 0);
            if ((*next == s) || (**next != '>')) {
                c = 0;
                *next = NULL;
            } else
                (*next)++;
        } else if (*s >= 'a' && *s <= 'z') {
            c = (*s - ('a' - 1));
            *next = s+1;
        } else if ((*s >= '@' && *s <= '_') || *s == '?' || (*s & 0x80)) {
            c = ('@' ^ *s);
            *next = s+1;
        } else if (*s == '~') {
            c = '^';
            *next = s+1;
        }
    }
    return c;
}